

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_pole_digital_filter.cc
# Opt level: O3

bool __thiscall
sptk::AllPoleDigitalFilter::Run
          (AllPoleDigitalFilter *this,vector<double,_std::allocator<double>_> *filter_coefficients,
          double filter_input,double *filter_output,Buffer *buffer)

{
  uint uVar1;
  double *pdVar2;
  bool bVar3;
  ulong uVar4;
  size_type __new_size;
  ulong uVar5;
  double *__s;
  double dVar6;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar3 = false;
  if (((buffer != (Buffer *)0x0) && (bVar3 = false, filter_output != (double *)0x0)) &&
     (__new_size = (size_type)this->num_filter_order_, bVar3 = false,
     (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish -
     (long)(filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start >> 3 == __new_size + 1)) {
    __s = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start;
    if ((long)(buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)__s >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(&buffer->d_,__new_size);
      __s = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
      pdVar2 = (buffer->d_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (__s != pdVar2) {
        memset(__s,0,((long)pdVar2 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
      }
    }
    pdVar2 = (filter_coefficients->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar6 = filter_input * *pdVar2;
    uVar1 = this->num_filter_order_;
    uVar4 = (ulong)uVar1;
    if (uVar4 != 0) {
      if (this->transposition_ == false) {
        if (1 < (int)uVar1) {
          uVar4 = uVar4 + 1;
          do {
            dVar6 = dVar6 - pdVar2[uVar4 - 1] * __s[uVar4 - 2];
            __s[uVar4 - 2] = __s[uVar4 - 3];
            uVar4 = uVar4 - 1;
          } while (2 < uVar4);
        }
        dVar6 = dVar6 - pdVar2[1] * *__s;
        *__s = dVar6;
      }
      else {
        dVar6 = dVar6 - *__s;
        if (1 < (int)uVar1) {
          uVar5 = 1;
          do {
            __s[uVar5 - 1] = pdVar2[uVar5] * dVar6 + __s[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
        __s[(long)(int)uVar1 + -1] = pdVar2[(int)uVar1] * dVar6;
      }
    }
    *filter_output = dVar6;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool AllPoleDigitalFilter::Run(const std::vector<double>& filter_coefficients,
                               double filter_input, double* filter_output,
                               AllPoleDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (buffer->d_.size() != static_cast<std::size_t>(num_filter_order_)) {
    buffer->d_.resize(num_filter_order_);
    std::fill(buffer->d_.begin(), buffer->d_.end(), 0.0);
  }

  const double gained_input(filter_input * filter_coefficients[0]);
  if (0 == num_filter_order_) {
    *filter_output = gained_input;
    return true;
  }

  const double* a(&(filter_coefficients[1]));
  double* d(&buffer->d_[0]);
  double sum(gained_input);

  // Apply all-pole filter.
  if (transposition_) {
    sum -= d[0];
    for (int m(1); m < num_filter_order_; ++m) {
      d[m - 1] = d[m] + a[m - 1] * sum;
    }
    d[num_filter_order_ - 1] = a[num_filter_order_ - 1] * sum;
  } else {
    for (int m(num_filter_order_ - 1); 0 < m; --m) {
      sum -= a[m] * d[m];
      d[m] = d[m - 1];
    }
    sum -= a[0] * d[0];
    d[0] = sum;
  }

  // Save result.
  *filter_output = sum;

  return true;
}